

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

int Abc_NodeRefDerefStop(Abc_Obj_t *pNode,int fReference)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  Abc_Obj_t *pNode_01;
  int local_34;
  int Counter;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  int fReference_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsCi(pNode);
  if (iVar1 == 0) {
    pNode_00 = Abc_ObjFanin0(pNode);
    pNode_01 = Abc_ObjFanin1(pNode);
    local_34 = 1;
    if (fReference == 0) {
      if ((pNode_00->vFanouts).nSize < 1) {
        __assert_fail("pNode0->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                      ,0xbf,"int Abc_NodeRefDerefStop(Abc_Obj_t *, int)");
      }
      if ((pNode_01->vFanouts).nSize < 1) {
        __assert_fail("pNode1->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                      ,0xc0,"int Abc_NodeRefDerefStop(Abc_Obj_t *, int)");
      }
      iVar1 = Abc_ObjFaninC0(pNode);
      if ((iVar1 == 0) &&
         (iVar1 = (pNode_00->vFanouts).nSize + -1, (pNode_00->vFanouts).nSize = iVar1, iVar1 == 0))
      {
        local_34 = Abc_NodeRefDerefStop(pNode_00,0);
        local_34 = local_34 + 1;
      }
      iVar1 = Abc_ObjFaninC1(pNode);
      if ((iVar1 == 0) &&
         (iVar1 = (pNode_01->vFanouts).nSize + -1, (pNode_01->vFanouts).nSize = iVar1, iVar1 == 0))
      {
        iVar1 = Abc_NodeRefDerefStop(pNode_01,0);
        local_34 = iVar1 + local_34;
      }
    }
    else {
      iVar1 = Abc_ObjFaninC0(pNode);
      if ((iVar1 == 0) &&
         (iVar1 = (pNode_00->vFanouts).nSize, (pNode_00->vFanouts).nSize = iVar1 + 1, iVar1 == 0)) {
        local_34 = Abc_NodeRefDerefStop(pNode_00,fReference);
        local_34 = local_34 + 1;
      }
      iVar1 = Abc_ObjFaninC1(pNode);
      if ((iVar1 == 0) &&
         (iVar1 = (pNode_01->vFanouts).nSize, (pNode_01->vFanouts).nSize = iVar1 + 1, iVar1 == 0)) {
        iVar1 = Abc_NodeRefDerefStop(pNode_01,fReference);
        local_34 = iVar1 + local_34;
      }
    }
    pNode_local._4_4_ = local_34;
  }
  else {
    pNode_local._4_4_ = 0;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NodeRefDerefStop( Abc_Obj_t * pNode, int fReference )
{
    Abc_Obj_t * pNode0, * pNode1;
    int Counter;
    // skip the CI
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    // process the internal node
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    Counter = 1;
    if ( fReference )
    {
        if ( !Abc_ObjFaninC0(pNode) && pNode0->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDerefStop( pNode0, fReference );
        if ( !Abc_ObjFaninC1(pNode) && pNode1->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDerefStop( pNode1, fReference );
    }
    else
    {
        assert( pNode0->vFanouts.nSize > 0 );
        assert( pNode1->vFanouts.nSize > 0 );
        if ( !Abc_ObjFaninC0(pNode) && --pNode0->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDerefStop( pNode0, fReference );
        if ( !Abc_ObjFaninC1(pNode) && --pNode1->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDerefStop( pNode1, fReference );
    }
    return Counter;
}